

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O2

size_t wabt::ReadU32Leb128(uint8_t *p,uint8_t *end,uint32_t *out_value)

{
  uint8_t uVar1;
  byte bVar2;
  size_t sVar3;
  uint uVar4;
  
  if ((p < end) && (uVar4 = (uint)(char)*p, -1 < (char)*p)) {
    sVar3 = 1;
  }
  else if ((p + 1 < end) && (uVar1 = p[1], -1 < (char)uVar1)) {
    uVar4 = *p & 0x7f | (int)(char)uVar1 << 7;
    sVar3 = 2;
  }
  else if ((p + 2 < end) && (uVar1 = p[2], -1 < (char)uVar1)) {
    uVar4 = *p & 0x7f | (p[1] & 0x7f) << 7 | (int)(char)uVar1 << 0xe;
    sVar3 = 3;
  }
  else if ((p + 3 < end) && (uVar1 = p[3], -1 < (char)uVar1)) {
    uVar4 = *p & 0x7f | (p[1] & 0x7f) << 7 | (p[2] & 0x7f) << 0xe | (int)(char)uVar1 << 0x15;
    sVar3 = 4;
  }
  else if ((p + 4 < end) && (bVar2 = p[4], -1 < (char)bVar2)) {
    if (0xf < bVar2) {
      return 0;
    }
    uVar4 = *p & 0x7f | (p[1] & 0x7f) << 7 | (p[2] & 0x7f) << 0xe | (p[3] & 0x7f) << 0x15 |
            (uint)bVar2 << 0x1c;
    sVar3 = 5;
  }
  else {
    uVar4 = 0;
    sVar3 = 0;
  }
  *out_value = uVar4;
  return sVar3;
}

Assistant:

size_t ReadU32Leb128(const uint8_t* p,
                     const uint8_t* end,
                     uint32_t* out_value) {
  if (p < end && (p[0] & 0x80) == 0) {
    *out_value = LEB128_1(uint32_t);
    return 1;
  } else if (p + 1 < end && (p[1] & 0x80) == 0) {
    *out_value = LEB128_2(uint32_t);
    return 2;
  } else if (p + 2 < end && (p[2] & 0x80) == 0) {
    *out_value = LEB128_3(uint32_t);
    return 3;
  } else if (p + 3 < end && (p[3] & 0x80) == 0) {
    *out_value = LEB128_4(uint32_t);
    return 4;
  } else if (p + 4 < end && (p[4] & 0x80) == 0) {
    // The top bits set represent values > 32 bits.
    if (p[4] & 0xf0) {
      return 0;
    }
    *out_value = LEB128_5(uint32_t);
    return 5;
  } else {
    // past the end.
    *out_value = 0;
    return 0;
  }
}